

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_noskills(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  char *unaff_retaddr;
  
  uVar1 = in_RDI->comm[0];
  _Var2 = std::pow<int,int>(0,0x59c50d);
  if ((uVar1 & (long)_Var2) == 0) {
    _Var2 = std::pow<int,int>(0,0x59c52e);
    in_RDI->comm[0] = (long)_Var2 | in_RDI->comm[0];
    send_to_char(unaff_retaddr,in_RDI);
  }
  else {
    _Var2 = std::pow<int,int>(0,0x59c568);
    in_RDI->comm[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RDI->comm[0];
    send_to_char(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void do_noskills(CHAR_DATA *ch, char *argument)
{
	if (!IS_SET(ch->comm, COMM_SWITCHSKILLS))
	{
		SET_BIT(ch->comm, COMM_SWITCHSKILLS);

		send_to_char("You will now have every skill when switched into a mob.\n\r", ch);
	}
	else
	{
		REMOVE_BIT(ch->comm, COMM_SWITCHSKILLS);

		send_to_char("You will no longer have your normal immortal skills when switched into a mob.\n\r", ch);
	}
}